

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd)

{
  BrokerBase *pBVar1;
  bool bVar2;
  FederateStates FVar3;
  GlobalFederateId GVar4;
  route_id rVar5;
  FederateState *pFVar6;
  CommonCore *in_RSI;
  CommonCore *in_RDI;
  route_id route;
  optional<helics::ActionMessage> rep;
  FederateState *fed;
  ActionMessage ncmd_1;
  ActionMessage ncmd;
  ActionMessage *in_stack_000002e8;
  FilterFederate *in_stack_000002f0;
  ActionMessage *in_stack_fffffffffffffd48;
  ActionMessage *in_stack_fffffffffffffd50;
  FederateState *this_00;
  GlobalFederateId in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  GlobalFederateId in_stack_fffffffffffffd84;
  CommonCore *in_stack_fffffffffffffd88;
  GlobalFederateId in_stack_fffffffffffffd94;
  ActionMessage *in_stack_fffffffffffffe30;
  FederateState *in_stack_fffffffffffffe38;
  GlobalBrokerId id;
  undefined4 uVar7;
  
  uVar7 = 0;
  bVar2 = GlobalFederateId::operator==
                    ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,(GlobalBrokerId)0x0);
  if (!bVar2) {
    id.gid = (in_RDI->super_BrokerBase).higher_broker_id.gid;
    bVar2 = GlobalFederateId::operator==
                      ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,id);
    if (!bVar2) {
      bVar2 = GlobalFederateId::operator==
                        ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,
                         (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      if (bVar2) {
        processCommandsForCore(in_RSI,(ActionMessage *)CONCAT44(uVar7,id.gid));
        return;
      }
      pBVar1 = &in_RSI->super_BrokerBase;
      GVar4 = std::atomic::operator_cast_to_GlobalFederateId
                        ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd48);
      bVar2 = GlobalFederateId::operator==((GlobalFederateId *)&pBVar1->global_id,GVar4);
      if (bVar2) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70.gid),
                   (ActionMessage *)in_RDI);
        FilterFederate::handleMessage(in_stack_000002f0,in_stack_000002e8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd50);
        return;
      }
      this_00 = (FederateState *)&(in_RSI->super_BrokerBase).global_id;
      GVar4 = std::atomic::operator_cast_to_GlobalFederateId
                        ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd48);
      bVar2 = GlobalFederateId::operator==((GlobalFederateId *)this_00,GVar4);
      if (bVar2) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70.gid),
                   (ActionMessage *)in_RDI);
        TranslatorFederate::handleMessage
                  ((TranslatorFederate *)ncmd._8_8_,(ActionMessage *)ncmd._0_8_);
        ActionMessage::~ActionMessage((ActionMessage *)this_00);
        return;
      }
      bVar2 = isLocal((CommonCore *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                      in_stack_fffffffffffffd84);
      if (!bVar2) {
        rVar5 = getRoute(in_RDI,in_stack_fffffffffffffd70);
        (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,(ulong)(uint)rVar5.rid,in_RSI);
        return;
      }
      pFVar6 = getFederateCore(in_stack_fffffffffffffd88,in_stack_fffffffffffffd94);
      if (pFVar6 == (FederateState *)0x0) {
        return;
      }
      FVar3 = FederateState::getState((FederateState *)0x55cc32);
      if ((FVar3 != FINISHED) &&
         (FVar3 = FederateState::getState((FederateState *)0x55cc43), FVar3 != ERRORED)) {
        FederateState::addAction(this_00,in_stack_fffffffffffffd48);
        return;
      }
      FederateState::processPostTerminationAction
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      bVar2 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x55cc82);
      if (bVar2) {
        std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x55cc92)
        ;
        routeMessage(in_RSI,(ActionMessage *)CONCAT44(uVar7,id.gid));
      }
      std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x55cccd);
      return;
    }
  }
  (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,in_RSI);
  return;
}

Assistant:

void CommonCore::routeMessage(const ActionMessage& cmd)
{
    if ((cmd.dest_id == parent_broker_id) || (cmd.dest_id == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (cmd.dest_id == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (cmd.dest_id == filterFedID) {
        auto ncmd{cmd};
        filterFed->handleMessage(ncmd);
    } else if (cmd.dest_id == translatorFedID) {
        auto ncmd{cmd};
        translatorFed->handleMessage(ncmd);
    } else if (isLocal(cmd.dest_id)) {
        auto* fed = getFederateCore(cmd.dest_id);
        if (fed != nullptr) {
            if ((fed->getState() != FederateStates::FINISHED) &&
                (fed->getState() != FederateStates::ERRORED)) {
                fed->addAction(cmd);
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(cmd.dest_id);
        transmit(route, cmd);
    }
}